

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::SourceCodeInfo_Location::SourceCodeInfo_Location
          (SourceCodeInfo_Location *this,Arena *arena)

{
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = arena;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SourceCodeInfo_Location_003ba1d8;
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->path_).current_size_ = 0;
  (this->path_).total_size_ = 0;
  (this->path_).arena_or_elements_ = arena;
  (this->span_).current_size_ = 0;
  (this->span_).total_size_ = 0;
  (this->span_).arena_or_elements_ = arena;
  (this->leading_detached_comments_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (scc_info_SourceCodeInfo_Location_google_2fprotobuf_2fdescriptor_2eproto.base.visit_status.
      super___atomic_base<int>._M_i != 0) {
    internal::InitSCCImpl
              (&scc_info_SourceCodeInfo_Location_google_2fprotobuf_2fdescriptor_2eproto.base);
  }
  (this->leading_comments_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->trailing_comments_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  return;
}

Assistant:

SourceCodeInfo_Location::SourceCodeInfo_Location(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(arena),
  path_(arena),
  span_(arena),
  leading_detached_comments_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.SourceCodeInfo.Location)
}